

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::apps::Recorder::getValue_abi_cxx11_
          (tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Recorder *this,size_t index)

{
  int iVar1;
  pointer pVVar2;
  pointer pbVar3;
  _Alloc_hider _Var4;
  pointer pcVar5;
  ulong uVar6;
  char local_58 [33];
  undefined8 local_37;
  undefined4 local_2f;
  undefined2 local_2b;
  char local_29;
  
  pVVar2 = (this->points).
           super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->points).
                 super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4) *
          -0x5555555555555555;
  if (uVar6 < index || uVar6 - index == 0) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = '\0';
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2 + 1) = local_37;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2 + 9) = local_2f;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2 + 0xd) = local_2b;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0xf] = local_29;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = 0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str = local_58;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_TimeRepresentation<count_time<9,_long>_>,_false>._M_head_impl.
    internalTimeCode = 0;
  }
  else {
    iVar1 = pVVar2[index].index;
    pbVar3 = (this->targets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2;
    _Var4._M_p = pVVar2[index].value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var4._M_p,
               _Var4._M_p + pVVar2[index].value._M_string_length);
    pcVar5 = pbVar3[iVar1]._M_dataplus._M_p;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = pbVar3[iVar1]._M_string_length;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str = pcVar5;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_TimeRepresentation<count_time<9,_long>_>,_false>._M_head_impl.
    internalTimeCode = pVVar2[index].time.internalTimeCode;
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Time, std::string_view, std::string> Recorder::getValue(std::size_t index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time, targets[points[index].index], points[index].value};
    }
    return {Time(), std::string(), std::string()};
}